

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

void __thiscall
TwoStageDynamicBayesianNetwork::~TwoStageDynamicBayesianNetwork
          (TwoStageDynamicBayesianNetwork *this)

{
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var1;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  reference ppCVar2;
  pointer ppvVar3;
  pointer ppuVar4;
  uint uVar5;
  
  for (uVar5 = 0;
      (long)(this->_m_Y_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_Y_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar5; uVar5 = uVar5 + 1) {
    ppCVar2 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (&this->_m_Y_CPDs,(ulong)uVar5);
    if (*ppCVar2 != (value_type)0x0) {
      (*(*ppCVar2)->_vptr_CPDDiscreteInterface[1])();
    }
  }
  for (uVar5 = 0;
      (long)(this->_m_O_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->_m_O_CPDs).
            super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)uVar5; uVar5 = uVar5 + 1) {
    ppCVar2 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (&this->_m_O_CPDs,(ulong)uVar5);
    if (*ppCVar2 != (value_type)0x0) {
      (*(*ppCVar2)->_vptr_CPDDiscreteInterface[1])();
    }
  }
  for (ppvVar3 = (this->_m_X_restr_perY).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->_m_X_restr_perY).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    p_Var1 = &(*ppvVar3)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
    }
    operator_delete(p_Var1,0x18);
  }
  for (ppvVar3 = (this->_m_A_restr_perY).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->_m_A_restr_perY).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    p_Var1 = &(*ppvVar3)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
    }
    operator_delete(p_Var1,0x18);
  }
  for (ppvVar3 = (this->_m_Y_restr_perY).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->_m_Y_restr_perY).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    p_Var1 = &(*ppvVar3)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
    }
    operator_delete(p_Var1,0x18);
  }
  for (ppvVar3 = (this->_m_X_restr_perO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->_m_X_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    p_Var1 = &(*ppvVar3)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
    }
    operator_delete(p_Var1,0x18);
  }
  for (ppvVar3 = (this->_m_A_restr_perO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->_m_A_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    p_Var1 = &(*ppvVar3)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
    }
    operator_delete(p_Var1,0x18);
  }
  for (ppvVar3 = (this->_m_Y_restr_perO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->_m_Y_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    p_Var1 = &(*ppvVar3)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
    }
    operator_delete(p_Var1,0x18);
  }
  for (ppvVar3 = (this->_m_O_restr_perO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar3 !=
      (this->_m_O_restr_perO).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar3 = ppvVar3 + 1) {
    p_Var1 = &(*ppvVar3)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
    }
    operator_delete(p_Var1,0x18);
  }
  for (ppuVar4 = (this->_m_nrVals_SoI_Y_stepsize).
                 super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppuVar4 !=
      (this->_m_nrVals_SoI_Y_stepsize).
      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppuVar4 = ppuVar4 + 1) {
    if (*ppuVar4 != (unsigned_long *)0x0) {
      operator_delete__(*ppuVar4);
    }
  }
  for (ppuVar4 = (this->_m_nrVals_SoI_O_stepsize).
                 super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppuVar4 !=
      (this->_m_nrVals_SoI_O_stepsize).
      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppuVar4 = ppuVar4 + 1) {
    if (*ppuVar4 != (unsigned_long *)0x0) {
      operator_delete__(*ppuVar4);
    }
  }
  p_Var1 = &this->_m_IndividualToJointYiiIndices_catVector->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
  if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
  }
  operator_delete(p_Var1,0x18);
  p_Var1 = &this->_m_IndividualToJointOiiIndices_catVector->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
  if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
  }
  operator_delete(p_Var1,0x18);
  p_Var1 = &this->_m_SampleY->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
  if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
  }
  operator_delete(p_Var1,0x18);
  p_Var1 = &this->_m_SampleO->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
  if (p_Var1 != (_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(p_Var1);
  }
  operator_delete(p_Var1,0x18);
  this_00 = &this->_m_SampleNrO->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  if (this_00 != (_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(this_00);
  }
  operator_delete(this_00,0x18);
  std::
  _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->_m_O_restr_perO).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::
  _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->_m_Y_restr_perO).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::
  _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->_m_A_restr_perO).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::
  _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->_m_X_restr_perO).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::
  _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->_m_Y_restr_perY).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::
  _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->_m_A_restr_perY).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::
  _Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~_Vector_base(&(this->_m_X_restr_perY).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 );
  std::_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~_Vector_base
            (&(this->_m_nrVals_SoI_O_stepsize).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>);
  std::_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~_Vector_base
            (&(this->_m_nrVals_SoI_Y_stepsize).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>);
  std::_Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~_Vector_base
            (&(this->_m_O_CPDs).
              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>);
  std::_Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~_Vector_base
            (&(this->_m_Y_CPDs).
              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_ii_size_O).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_Oii_size_O).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_Yii_size_O).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_Aii_size_O).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_Xii_size_O).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_SoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_OSoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_YSoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_ASoI_O);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_XSoI_O);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_ii_size_Y).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_Yii_size_Y).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_Aii_size_Y).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_Xii_size_Y).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_SoI_Y);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_YSoI_Y);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_ASoI_Y);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->_m_nrVals_XSoI_Y);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_OSoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_YSoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_ASoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_XSoI_O);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_YSoI_Y);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_ASoI_Y);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_XSoI_Y);
  return;
}

Assistant:

TwoStageDynamicBayesianNetwork::~TwoStageDynamicBayesianNetwork()
{
    for(Index i=0;i!=_m_Y_CPDs.size();++i)
        delete _m_Y_CPDs.at(i);
    for(Index i=0;i!=_m_O_CPDs.size();++i)
        delete _m_O_CPDs.at(i);

    // delete by iterator, as temporary data may not be allocated when
    // reading from disk
    { std::vector<std::vector<Index>* >::iterator it;
        for (it=_m_X_restr_perY.begin();it!=_m_X_restr_perY.end();it++)
            delete *it;
        for (it=_m_A_restr_perY.begin();it!=_m_A_restr_perY.end();it++)
            delete *it;
        for (it=_m_Y_restr_perY.begin();it!=_m_Y_restr_perY.end();it++)
            delete *it;

        for (it=_m_X_restr_perO.begin();it!=_m_X_restr_perO.end();it++)
            delete *it;
        for (it=_m_A_restr_perO.begin();it!=_m_A_restr_perO.end();it++)
            delete *it;
        for (it=_m_Y_restr_perO.begin();it!=_m_Y_restr_perO.end();it++)
            delete *it;
        for (it=_m_O_restr_perO.begin();it!=_m_O_restr_perO.end();it++)
            delete *it;
    }
    { std::vector<size_t*>::iterator it;
        for (it=_m_nrVals_SoI_Y_stepsize.begin();it!=_m_nrVals_SoI_Y_stepsize.end();it++)
            delete [] *it;
        for (it=_m_nrVals_SoI_O_stepsize.begin();it!=_m_nrVals_SoI_O_stepsize.end();it++)
            delete [] *it;
    }

    delete _m_IndividualToJointYiiIndices_catVector;
    delete _m_IndividualToJointOiiIndices_catVector;
    delete _m_SampleY;
    delete _m_SampleO;
    delete _m_SampleNrO;
}